

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_work_thread
          (disp_data_source_t *this,mbox_t *mbox,string *group_name,thread_with_refcounter_t *wt)

{
  element_type *peVar1;
  activity_tracking_impl_t *this_00;
  long lVar2;
  char cVar3;
  size_t sVar4;
  undefined1 *puVar5;
  long lVar6;
  prefix_t prefix;
  ostringstream ss;
  suffix_t local_210;
  id local_208;
  work_thread_activity_stats_t local_200;
  prefix_t local_1d0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  sVar4 = strlen((this->m_base_prefix).m_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(this->m_base_prefix).m_value,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"/wt-",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(group_name->_M_dataplus)._M_p,group_name->_M_string_length);
  std::__cxx11::stringbuf::str();
  cVar3 = *(char *)local_200.m_working_stats.m_count;
  if (cVar3 == '\0') {
    puVar5 = local_1d0.m_value;
  }
  else {
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      *(char *)((long)&local_1d0 + lVar6) = cVar3;
      cVar3 = *(char *)(local_200.m_working_stats.m_count + lVar6 + 1);
      if (cVar3 == '\0') break;
      lVar2 = lVar6 + 1;
    } while (lVar6 != 0x2e);
    puVar5 = (undefined1 *)((long)&local_1d0 + lVar6 + 1);
  }
  *puVar5 = 0;
  if ((duration_t *)local_200.m_working_stats.m_count != &local_200.m_working_stats.m_avg_time) {
    operator_delete((void *)local_200.m_working_stats.m_count);
  }
  local_200.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long_const&>
            (mbox,&local_1d0,(suffix_t *)&local_200,&wt->m_user_agent);
  local_200.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::work_thread_queue_size();
  peVar1 = (wt->m_thread).
           super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_210.m_value =
       (char *)reuse::work_thread::demand_queue_details::
               queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
               ::demands_count(&(peVar1->super_activity_tracking_impl_t).
                                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                                .m_queue,
                               &(peVar1->super_activity_tracking_impl_t).
                                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                                .m_demands_count);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&local_1d0,(suffix_t *)&local_200,(unsigned_long *)&local_210);
  this_00 = &((wt->m_thread).
              super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_activity_tracking_impl_t;
  local_210 = stats::suffixes::work_thread_activity();
  local_208._M_thread =
       (this_00->
       super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
       ).m_thread_id._M_thread;
  reuse::work_thread::details::activity_tracking_impl_t::take_activity_stats(&local_200,this_00);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&local_1d0,&local_210,&local_208,&local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void
				distribute_value_for_work_thread(
					const so_5::mbox_t & mbox,
					const std::string & group_name,
					const thread_with_refcounter_t & wt )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/wt-" << group_name;

						const stats::prefix_t prefix{ ss.str() };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::agent_count(),
								wt.m_user_agent );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::work_thread_queue_size(),
								wt.m_thread->demands_count() );

						send_thread_activity_stats(
								mbox,
								prefix,
								*(wt.m_thread) );
					}